

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O0

size_t gmlc::utilities::base64_decode(string_view encoded_string,void *data,size_t max_size)

{
  byte bVar1;
  value_type_conflict2 vVar2;
  value_type_conflict2 vVar3;
  char cVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  int iVar9;
  size_type sVar10;
  const_reference pvVar11;
  value_type_conflict2 *pvVar12;
  reference pvVar13;
  byte *pbVar14;
  reference pvVar15;
  ulong in_RCX;
  long in_RDX;
  long lVar16;
  bool bVar17;
  int j_1;
  int j;
  size_t dataIndex;
  uchar *outData;
  array<unsigned_char,_4UL> char_array_4;
  array<unsigned_char,_3UL> char_array_3;
  int indexIn;
  int indexOut;
  size_type in_len;
  undefined7 in_stack_ffffffffffffff68;
  uchar in_stack_ffffffffffffff6f;
  undefined1 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff71;
  undefined1 in_stack_ffffffffffffff72;
  undefined1 in_stack_ffffffffffffff73;
  undefined4 in_stack_ffffffffffffff74;
  bool local_59;
  int local_58;
  int local_54;
  ulong local_50;
  undefined1 local_3f [4];
  undefined1 local_3b [3];
  int local_38;
  int local_34;
  size_type local_30;
  ulong local_28;
  long local_20;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_30 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
  local_34 = 0;
  local_38 = 0;
  memset(local_3b,0,3);
  memset(local_3f,0,4);
  local_50 = 0;
  do {
    do {
      sVar10 = local_30 - 1;
      bVar17 = local_30 != 0;
      local_59 = false;
      local_30 = sVar10;
      if (bVar17) {
        pvVar11 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                            (&local_18,(long)local_38);
        local_59 = false;
        if (*pvVar11 != '=') {
          std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                    (&local_18,(long)local_38);
          local_59 = isBase64('\0');
        }
      }
      if (local_59 == false) {
        if (0 < local_34) {
          for (local_54 = local_34; local_54 < 4; local_54 = local_54 + 1) {
            pvVar13 = std::array<unsigned_char,_4UL>::operator[]
                                ((array<unsigned_char,_4UL> *)
                                 CONCAT44(in_stack_ffffffffffffff74,
                                          CONCAT13(in_stack_ffffffffffffff73,
                                                   CONCAT12(in_stack_ffffffffffffff72,
                                                            CONCAT11(in_stack_ffffffffffffff71,
                                                                     in_stack_ffffffffffffff70)))),
                                 CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
            *pvVar13 = '\0';
          }
          std::array<unsigned_char,_4UL>::operator[]
                    ((array<unsigned_char,_4UL> *)
                     CONCAT44(in_stack_ffffffffffffff74,
                              CONCAT13(in_stack_ffffffffffffff73,
                                       CONCAT12(in_stack_ffffffffffffff72,
                                                CONCAT11(in_stack_ffffffffffffff71,
                                                         in_stack_ffffffffffffff70)))),
                     CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          uVar5 = CharMapper<unsigned_char>::operator[]
                            ((CharMapper<unsigned_char> *)
                             CONCAT44(in_stack_ffffffffffffff74,
                                      CONCAT13(in_stack_ffffffffffffff73,
                                               CONCAT12(in_stack_ffffffffffffff72,
                                                        CONCAT11(in_stack_ffffffffffffff71,
                                                                 in_stack_ffffffffffffff70)))),
                             in_stack_ffffffffffffff6f);
          pvVar13 = std::array<unsigned_char,_4UL>::operator[]
                              ((array<unsigned_char,_4UL> *)
                               CONCAT44(in_stack_ffffffffffffff74,
                                        CONCAT13(in_stack_ffffffffffffff73,
                                                 CONCAT12(in_stack_ffffffffffffff72,
                                                          CONCAT11(in_stack_ffffffffffffff71,uVar5))
                                                )),
                               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          *pvVar13 = uVar5;
          std::array<unsigned_char,_4UL>::operator[]
                    ((array<unsigned_char,_4UL> *)
                     CONCAT44(in_stack_ffffffffffffff74,
                              CONCAT13(in_stack_ffffffffffffff73,
                                       CONCAT12(in_stack_ffffffffffffff72,
                                                CONCAT11(in_stack_ffffffffffffff71,uVar5)))),
                     CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          uVar6 = CharMapper<unsigned_char>::operator[]
                            ((CharMapper<unsigned_char> *)
                             CONCAT44(in_stack_ffffffffffffff74,
                                      CONCAT13(in_stack_ffffffffffffff73,
                                               CONCAT12(in_stack_ffffffffffffff72,
                                                        CONCAT11(in_stack_ffffffffffffff71,uVar5))))
                             ,in_stack_ffffffffffffff6f);
          pvVar13 = std::array<unsigned_char,_4UL>::operator[]
                              ((array<unsigned_char,_4UL> *)
                               CONCAT44(in_stack_ffffffffffffff74,
                                        CONCAT13(in_stack_ffffffffffffff73,
                                                 CONCAT12(in_stack_ffffffffffffff72,
                                                          CONCAT11(uVar6,uVar5)))),
                               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          *pvVar13 = uVar6;
          std::array<unsigned_char,_4UL>::operator[]
                    ((array<unsigned_char,_4UL> *)
                     CONCAT44(in_stack_ffffffffffffff74,
                              CONCAT13(in_stack_ffffffffffffff73,
                                       CONCAT12(in_stack_ffffffffffffff72,CONCAT11(uVar6,uVar5)))),
                     CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          uVar7 = CharMapper<unsigned_char>::operator[]
                            ((CharMapper<unsigned_char> *)
                             CONCAT44(in_stack_ffffffffffffff74,
                                      CONCAT13(in_stack_ffffffffffffff73,
                                               CONCAT12(in_stack_ffffffffffffff72,
                                                        CONCAT11(uVar6,uVar5)))),
                             in_stack_ffffffffffffff6f);
          pvVar13 = std::array<unsigned_char,_4UL>::operator[]
                              ((array<unsigned_char,_4UL> *)
                               CONCAT44(in_stack_ffffffffffffff74,
                                        CONCAT13(in_stack_ffffffffffffff73,
                                                 CONCAT12(uVar7,CONCAT11(uVar6,uVar5)))),
                               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          *pvVar13 = uVar7;
          std::array<unsigned_char,_4UL>::operator[]
                    ((array<unsigned_char,_4UL> *)
                     CONCAT44(in_stack_ffffffffffffff74,
                              CONCAT13(in_stack_ffffffffffffff73,
                                       CONCAT12(uVar7,CONCAT11(uVar6,uVar5)))),
                     CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          uVar8 = CharMapper<unsigned_char>::operator[]
                            ((CharMapper<unsigned_char> *)
                             CONCAT44(in_stack_ffffffffffffff74,
                                      CONCAT13(in_stack_ffffffffffffff73,
                                               CONCAT12(uVar7,CONCAT11(uVar6,uVar5)))),
                             in_stack_ffffffffffffff6f);
          pvVar13 = std::array<unsigned_char,_4UL>::operator[]
                              ((array<unsigned_char,_4UL> *)
                               CONCAT44(in_stack_ffffffffffffff74,
                                        CONCAT13(uVar8,CONCAT12(uVar7,CONCAT11(uVar6,uVar5)))),
                               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          *pvVar13 = uVar8;
          pbVar14 = std::array<unsigned_char,_4UL>::operator[]
                              ((array<unsigned_char,_4UL> *)
                               CONCAT44(in_stack_ffffffffffffff74,
                                        CONCAT13(uVar8,CONCAT12(uVar7,CONCAT11(uVar6,uVar5)))),
                               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          iVar9 = (uint)*pbVar14 << 2;
          pbVar14 = std::array<unsigned_char,_4UL>::operator[]
                              ((array<unsigned_char,_4UL> *)
                               CONCAT44(iVar9,CONCAT13(uVar8,CONCAT12(uVar7,CONCAT11(uVar6,uVar5))))
                               ,CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          bVar1 = *pbVar14;
          cVar4 = (char)iVar9;
          pvVar15 = std::array<unsigned_char,_3UL>::operator[]
                              ((array<unsigned_char,_3UL> *)
                               CONCAT44(iVar9,CONCAT13(uVar8,CONCAT12(uVar7,CONCAT11(uVar6,uVar5))))
                               ,CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          *pvVar15 = cVar4 + (char)((bVar1 & 0x30) >> 4);
          pvVar13 = std::array<unsigned_char,_4UL>::operator[]
                              ((array<unsigned_char,_4UL> *)
                               CONCAT44(iVar9,CONCAT13(uVar8,CONCAT12(uVar7,CONCAT11(uVar6,uVar5))))
                               ,CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          vVar2 = *pvVar13;
          pbVar14 = std::array<unsigned_char,_4UL>::operator[]
                              ((array<unsigned_char,_4UL> *)
                               CONCAT44(iVar9,CONCAT13(uVar8,CONCAT12(uVar7,CONCAT11(uVar6,uVar5))))
                               ,CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          bVar1 = *pbVar14;
          pvVar15 = std::array<unsigned_char,_3UL>::operator[]
                              ((array<unsigned_char,_3UL> *)
                               CONCAT44(iVar9,CONCAT13(uVar8,CONCAT12(uVar7,CONCAT11(uVar6,uVar5))))
                               ,CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          *pvVar15 = vVar2 * '\x10' + (char)((bVar1 & 0x3c) >> 2);
          pvVar13 = std::array<unsigned_char,_4UL>::operator[]
                              ((array<unsigned_char,_4UL> *)
                               CONCAT44(iVar9,CONCAT13(uVar8,CONCAT12(uVar7,CONCAT11(uVar6,uVar5))))
                               ,CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          vVar2 = *pvVar13;
          pvVar13 = std::array<unsigned_char,_4UL>::operator[]
                              ((array<unsigned_char,_4UL> *)
                               CONCAT44(iVar9,CONCAT13(uVar8,CONCAT12(uVar7,CONCAT11(uVar6,uVar5))))
                               ,CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          vVar3 = *pvVar13;
          pvVar15 = std::array<unsigned_char,_3UL>::operator[]
                              ((array<unsigned_char,_3UL> *)
                               CONCAT44(iVar9,CONCAT13(uVar8,CONCAT12(uVar7,CONCAT11(uVar6,uVar5))))
                               ,CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
          *pvVar15 = vVar2 * '@' + vVar3;
          for (local_58 = 0; local_58 < local_34 + -1; local_58 = local_58 + 1) {
            if (local_50 < local_28) {
              pvVar15 = std::array<unsigned_char,_3UL>::operator[]
                                  ((array<unsigned_char,_3UL> *)
                                   CONCAT44(iVar9,CONCAT13(uVar8,CONCAT12(uVar7,CONCAT11(uVar6,uVar5
                                                                                        )))),
                                   CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
              *(value_type_conflict2 *)(local_20 + local_50) = *pvVar15;
              local_50 = local_50 + 1;
            }
          }
        }
        return local_50;
      }
      pvVar12 = (value_type_conflict2 *)
                std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                          (&local_18,(long)local_38);
      vVar2 = *pvVar12;
      local_34 = local_34 + 1;
      pvVar13 = std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)
                           CONCAT44(in_stack_ffffffffffffff74,
                                    CONCAT13(in_stack_ffffffffffffff73,
                                             CONCAT12(in_stack_ffffffffffffff72,
                                                      CONCAT11(in_stack_ffffffffffffff71,
                                                               in_stack_ffffffffffffff70)))),
                           CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      *pvVar13 = vVar2;
      local_38 = local_38 + 1;
    } while (local_34 != 4);
    std::array<unsigned_char,_4UL>::operator[]
              ((array<unsigned_char,_4UL> *)
               CONCAT44(in_stack_ffffffffffffff74,
                        CONCAT13(in_stack_ffffffffffffff73,
                                 CONCAT12(in_stack_ffffffffffffff72,
                                          CONCAT11(in_stack_ffffffffffffff71,
                                                   in_stack_ffffffffffffff70)))),
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    uVar5 = CharMapper<unsigned_char>::operator[]
                      ((CharMapper<unsigned_char> *)
                       CONCAT44(in_stack_ffffffffffffff74,
                                CONCAT13(in_stack_ffffffffffffff73,
                                         CONCAT12(in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70)))),
                       in_stack_ffffffffffffff6f);
    pvVar13 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_ffffffffffffff74,
                                  CONCAT13(in_stack_ffffffffffffff73,
                                           CONCAT12(in_stack_ffffffffffffff72,
                                                    CONCAT11(in_stack_ffffffffffffff71,
                                                             in_stack_ffffffffffffff70)))),
                         CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    *pvVar13 = uVar5;
    std::array<unsigned_char,_4UL>::operator[]
              ((array<unsigned_char,_4UL> *)
               CONCAT44(in_stack_ffffffffffffff74,
                        CONCAT13(in_stack_ffffffffffffff73,
                                 CONCAT12(in_stack_ffffffffffffff72,
                                          CONCAT11(in_stack_ffffffffffffff71,
                                                   in_stack_ffffffffffffff70)))),
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    uVar5 = CharMapper<unsigned_char>::operator[]
                      ((CharMapper<unsigned_char> *)
                       CONCAT44(in_stack_ffffffffffffff74,
                                CONCAT13(in_stack_ffffffffffffff73,
                                         CONCAT12(in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70)))),
                       in_stack_ffffffffffffff6f);
    pvVar13 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_ffffffffffffff74,
                                  CONCAT13(in_stack_ffffffffffffff73,
                                           CONCAT12(in_stack_ffffffffffffff72,
                                                    CONCAT11(in_stack_ffffffffffffff71,
                                                             in_stack_ffffffffffffff70)))),
                         CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    *pvVar13 = uVar5;
    std::array<unsigned_char,_4UL>::operator[]
              ((array<unsigned_char,_4UL> *)
               CONCAT44(in_stack_ffffffffffffff74,
                        CONCAT13(in_stack_ffffffffffffff73,
                                 CONCAT12(in_stack_ffffffffffffff72,
                                          CONCAT11(in_stack_ffffffffffffff71,
                                                   in_stack_ffffffffffffff70)))),
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    uVar5 = CharMapper<unsigned_char>::operator[]
                      ((CharMapper<unsigned_char> *)
                       CONCAT44(in_stack_ffffffffffffff74,
                                CONCAT13(in_stack_ffffffffffffff73,
                                         CONCAT12(in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70)))),
                       in_stack_ffffffffffffff6f);
    pvVar13 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_ffffffffffffff74,
                                  CONCAT13(in_stack_ffffffffffffff73,
                                           CONCAT12(in_stack_ffffffffffffff72,
                                                    CONCAT11(in_stack_ffffffffffffff71,
                                                             in_stack_ffffffffffffff70)))),
                         CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    *pvVar13 = uVar5;
    std::array<unsigned_char,_4UL>::operator[]
              ((array<unsigned_char,_4UL> *)
               CONCAT44(in_stack_ffffffffffffff74,
                        CONCAT13(in_stack_ffffffffffffff73,
                                 CONCAT12(in_stack_ffffffffffffff72,
                                          CONCAT11(in_stack_ffffffffffffff71,
                                                   in_stack_ffffffffffffff70)))),
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    uVar5 = CharMapper<unsigned_char>::operator[]
                      ((CharMapper<unsigned_char> *)
                       CONCAT44(in_stack_ffffffffffffff74,
                                CONCAT13(in_stack_ffffffffffffff73,
                                         CONCAT12(in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70)))),
                       in_stack_ffffffffffffff6f);
    pvVar13 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_ffffffffffffff74,
                                  CONCAT13(in_stack_ffffffffffffff73,
                                           CONCAT12(in_stack_ffffffffffffff72,
                                                    CONCAT11(in_stack_ffffffffffffff71,
                                                             in_stack_ffffffffffffff70)))),
                         CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    *pvVar13 = uVar5;
    pvVar13 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_ffffffffffffff74,
                                  CONCAT13(in_stack_ffffffffffffff73,
                                           CONCAT12(in_stack_ffffffffffffff72,
                                                    CONCAT11(in_stack_ffffffffffffff71,
                                                             in_stack_ffffffffffffff70)))),
                         CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    vVar2 = *pvVar13;
    pbVar14 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_ffffffffffffff74,
                                  CONCAT13(in_stack_ffffffffffffff73,
                                           CONCAT12(in_stack_ffffffffffffff72,
                                                    CONCAT11(in_stack_ffffffffffffff71,
                                                             in_stack_ffffffffffffff70)))),
                         CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    bVar1 = *pbVar14;
    pvVar15 = std::array<unsigned_char,_3UL>::operator[]
                        ((array<unsigned_char,_3UL> *)
                         CONCAT44(in_stack_ffffffffffffff74,
                                  CONCAT13(in_stack_ffffffffffffff73,
                                           CONCAT12(in_stack_ffffffffffffff72,
                                                    CONCAT11(in_stack_ffffffffffffff71,
                                                             in_stack_ffffffffffffff70)))),
                         CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    *pvVar15 = vVar2 * '\x04' + (char)((bVar1 & 0x30) >> 4);
    pvVar13 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_ffffffffffffff74,
                                  CONCAT13(in_stack_ffffffffffffff73,
                                           CONCAT12(in_stack_ffffffffffffff72,
                                                    CONCAT11(in_stack_ffffffffffffff71,
                                                             in_stack_ffffffffffffff70)))),
                         CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    vVar2 = *pvVar13;
    pbVar14 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_ffffffffffffff74,
                                  CONCAT13(in_stack_ffffffffffffff73,
                                           CONCAT12(in_stack_ffffffffffffff72,
                                                    CONCAT11(in_stack_ffffffffffffff71,
                                                             in_stack_ffffffffffffff70)))),
                         CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    bVar1 = *pbVar14;
    pvVar15 = std::array<unsigned_char,_3UL>::operator[]
                        ((array<unsigned_char,_3UL> *)
                         CONCAT44(in_stack_ffffffffffffff74,
                                  CONCAT13(in_stack_ffffffffffffff73,
                                           CONCAT12(in_stack_ffffffffffffff72,
                                                    CONCAT11(in_stack_ffffffffffffff71,
                                                             in_stack_ffffffffffffff70)))),
                         CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    *pvVar15 = vVar2 * '\x10' + (char)((bVar1 & 0x3c) >> 2);
    pvVar13 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_ffffffffffffff74,
                                  CONCAT13(in_stack_ffffffffffffff73,
                                           CONCAT12(in_stack_ffffffffffffff72,
                                                    CONCAT11(in_stack_ffffffffffffff71,
                                                             in_stack_ffffffffffffff70)))),
                         CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    vVar2 = *pvVar13;
    pvVar13 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_ffffffffffffff74,
                                  CONCAT13(in_stack_ffffffffffffff73,
                                           CONCAT12(in_stack_ffffffffffffff72,
                                                    CONCAT11(in_stack_ffffffffffffff71,
                                                             in_stack_ffffffffffffff70)))),
                         CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    vVar3 = *pvVar13;
    pvVar15 = std::array<unsigned_char,_3UL>::operator[]
                        ((array<unsigned_char,_3UL> *)
                         CONCAT44(in_stack_ffffffffffffff74,
                                  CONCAT13(in_stack_ffffffffffffff73,
                                           CONCAT12(in_stack_ffffffffffffff72,
                                                    CONCAT11(in_stack_ffffffffffffff71,
                                                             in_stack_ffffffffffffff70)))),
                         CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    *pvVar15 = vVar2 * '@' + vVar3;
    if (local_50 + 2 < local_28) {
      pvVar15 = std::array<unsigned_char,_3UL>::operator[]
                          ((array<unsigned_char,_3UL> *)
                           CONCAT44(in_stack_ffffffffffffff74,
                                    CONCAT13(in_stack_ffffffffffffff73,
                                             CONCAT12(in_stack_ffffffffffffff72,
                                                      CONCAT11(in_stack_ffffffffffffff71,
                                                               in_stack_ffffffffffffff70)))),
                           CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      *(value_type_conflict2 *)(local_20 + local_50) = *pvVar15;
      pvVar15 = std::array<unsigned_char,_3UL>::operator[]
                          ((array<unsigned_char,_3UL> *)
                           CONCAT44(in_stack_ffffffffffffff74,
                                    CONCAT13(in_stack_ffffffffffffff73,
                                             CONCAT12(in_stack_ffffffffffffff72,
                                                      CONCAT11(in_stack_ffffffffffffff71,
                                                               in_stack_ffffffffffffff70)))),
                           CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      lVar16 = local_50 + 2;
      *(value_type_conflict2 *)(local_20 + local_50 + 1) = *pvVar15;
      pvVar15 = std::array<unsigned_char,_3UL>::operator[]
                          ((array<unsigned_char,_3UL> *)
                           CONCAT44(in_stack_ffffffffffffff74,
                                    CONCAT13(in_stack_ffffffffffffff73,
                                             CONCAT12(in_stack_ffffffffffffff72,
                                                      CONCAT11(in_stack_ffffffffffffff71,
                                                               in_stack_ffffffffffffff70)))),
                           CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      local_50 = local_50 + 3;
      *(value_type_conflict2 *)(local_20 + lVar16) = *pvVar15;
    }
    else {
      if (local_50 + 1 < local_28) {
        pvVar15 = std::array<unsigned_char,_3UL>::operator[]
                            ((array<unsigned_char,_3UL> *)
                             CONCAT44(in_stack_ffffffffffffff74,
                                      CONCAT13(in_stack_ffffffffffffff73,
                                               CONCAT12(in_stack_ffffffffffffff72,
                                                        CONCAT11(in_stack_ffffffffffffff71,
                                                                 in_stack_ffffffffffffff70)))),
                             CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
        *(value_type_conflict2 *)(local_20 + local_50) = *pvVar15;
        pvVar15 = std::array<unsigned_char,_3UL>::operator[]
                            ((array<unsigned_char,_3UL> *)
                             CONCAT44(in_stack_ffffffffffffff74,
                                      CONCAT13(in_stack_ffffffffffffff73,
                                               CONCAT12(in_stack_ffffffffffffff72,
                                                        CONCAT11(in_stack_ffffffffffffff71,
                                                                 in_stack_ffffffffffffff70)))),
                             CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
        *(value_type_conflict2 *)(local_20 + local_50 + 1) = *pvVar15;
        return local_50 + 2;
      }
      if (local_50 < local_28) {
        pvVar15 = std::array<unsigned_char,_3UL>::operator[]
                            ((array<unsigned_char,_3UL> *)
                             CONCAT44(in_stack_ffffffffffffff74,
                                      CONCAT13(in_stack_ffffffffffffff73,
                                               CONCAT12(in_stack_ffffffffffffff72,
                                                        CONCAT11(in_stack_ffffffffffffff71,
                                                                 in_stack_ffffffffffffff70)))),
                             CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
        *(value_type_conflict2 *)(local_20 + local_50) = *pvVar15;
        return local_50 + 1;
      }
    }
    local_34 = 0;
  } while( true );
}

Assistant:

size_t
    base64_decode(std::string_view encoded_string, void* data, size_t max_size)
{
    auto in_len = encoded_string.size();
    int indexOut = 0;
    int indexIn = 0;
    std::array<unsigned char, 3> char_array_3{{'\0', '\0', '\0'}};
    std::array<unsigned char, 4> char_array_4{{'\0', '\0', '\0', '\0'}};
    auto* outData = static_cast<unsigned char*>(data);
    size_t dataIndex = 0U;
    while (((in_len--) != 0U) && (encoded_string[indexIn] != '=') &&
           isBase64(encoded_string[indexIn])) {
        char_array_4[indexOut++] = encoded_string[indexIn];
        indexIn++;
        if (indexOut == 4) {
            char_array_4[0] = b64Map[char_array_4[0]];
            char_array_4[1] = b64Map[char_array_4[1]];
            char_array_4[2] = b64Map[char_array_4[2]];
            char_array_4[3] = b64Map[char_array_4[3]];

            char_array_3[0] =
                (char_array_4[0] << 2U) + ((char_array_4[1] & 0x30U) >> 4U);
            char_array_3[1] = ((char_array_4[1] & 0xfU) << 4U) +
                ((char_array_4[2] & 0x3cU) >> 2U);
            char_array_3[2] =
                ((char_array_4[2] & 0x3U) << 6U) + char_array_4[3];
            if (dataIndex + 2 < max_size) {
                outData[dataIndex++] = char_array_3[0];
                outData[dataIndex++] = char_array_3[1];
                outData[dataIndex++] = char_array_3[2];
            } else if (dataIndex + 1 < max_size) {
                outData[dataIndex++] = char_array_3[0];
                outData[dataIndex++] = char_array_3[1];
                return dataIndex;
            } else if (dataIndex < max_size) {
                outData[dataIndex++] = char_array_3[0];
                return dataIndex;
            }

            indexOut = 0;
        }
    }

    if (indexOut > 0) {
        for (int j = indexOut; j < 4; j++) {
            char_array_4[j] = 0;
        }
        char_array_4[0] = b64Map[char_array_4[0]];
        char_array_4[1] = b64Map[char_array_4[1]];
        char_array_4[2] = b64Map[char_array_4[2]];
        char_array_4[3] = b64Map[char_array_4[3]];

        char_array_3[0] =
            (char_array_4[0] << 2U) + ((char_array_4[1] & 0x30U) >> 4U);
        char_array_3[1] = ((char_array_4[1] & 0xfU) << 4U) +
            ((char_array_4[2] & 0x3cU) >> 2U);
        char_array_3[2] = ((char_array_4[2] & 0x3U) << 6U) + char_array_4[3];

        for (int j = 0; (j < indexOut - 1); j++) {
            if (dataIndex < max_size) {
                outData[dataIndex++] = char_array_3[j];
            }
        }
    }
    return dataIndex;
}